

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O1

bool __thiscall cmCTestVC::InitialCheckout(cmCTestVC *this,char *command)

{
  char **ppcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  string *arg;
  pointer pbVar6;
  OutputLogger out;
  string parent;
  vector<const_char_*,_std::allocator<const_char_*>_> vc_co;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream cmCTestLog_msg;
  OutputLogger err;
  OutputLogger local_298;
  string local_258;
  vector<const_char_*,_std::allocator<const_char_*>_> local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  long *local_208;
  long local_1f8 [2];
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [6];
  ios_base local_178 [264];
  OutputLogger local_70;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,"   First perform the initial checkout: ",0x27);
  if (command == (char *)0x0) {
    std::ios::clear((int)&local_298 + (int)*(_func_int **)(local_1e8._0_8_ + -0x18) + 0xb0);
  }
  else {
    sVar4 = strlen(command);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,command,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0x2a,(char *)local_298.super_LineParser.super_OutputParser._vptr_OutputParser,false)
  ;
  ppcVar1 = &local_298.super_LineParser.Prefix;
  if (local_298.super_LineParser.super_OutputParser._vptr_OutputParser != (_func_int **)ppcVar1) {
    operator_delete(local_298.super_LineParser.super_OutputParser._vptr_OutputParser,
                    (ulong)(local_298.super_LineParser.Prefix + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base(local_178);
  cmsys::SystemTools::GetFilenamePath(&local_258,&this->SourceDirectory);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1e8,"   Perform checkout in directory: ",0x22);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1e8,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0x2f,(char *)local_298.super_LineParser.super_OutputParser._vptr_OutputParser,false)
  ;
  if (local_298.super_LineParser.super_OutputParser._vptr_OutputParser != (_func_int **)ppcVar1) {
    operator_delete(local_298.super_LineParser.super_OutputParser._vptr_OutputParser,
                    (ulong)(local_298.super_LineParser.Prefix + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base(local_178);
  bVar3 = cmsys::SystemTools::MakeDirectory(&local_258,(mode_t *)0x0);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,command,(allocator<char> *)&local_298);
    cmSystemTools::ParseArguments(&local_220,(string *)local_1e8);
    if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
      operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
    }
    local_238.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (char **)0x0;
    local_238.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
              (&local_238,
               ((long)local_220.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_220.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
    if (local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_220.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar6 = local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_1e8._0_8_ = (pbVar6->_M_dataplus)._M_p;
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_238,(char **)local_1e8)
        ;
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != local_220.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_1e8._0_8_ = (_func_int **)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_238,(char **)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->Log,"--- Begin Initial Checkout ---\n",0x1f);
    cmProcessTools::OutputLogger::OutputLogger(&local_298,this->Log,"co-out> ");
    cmProcessTools::OutputLogger::OutputLogger(&local_70,this->Log,"co-err> ");
    bVar3 = RunChild(this,local_238.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&local_298,
                     (OutputParser *)&local_70,local_258._M_dataplus._M_p,Auto);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->Log,"--- End Initial Checkout ---\n",0x1d);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"Initial checkout failed!",0x18);
      std::ios::widen((char)(ostream *)local_1e8 + (char)*(_func_int **)(local_1e8._0_8_ + -0x18));
      std::ostream::put((char)local_1e8);
      std::ostream::flush();
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
                   ,0x47,(char *)local_208,false);
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base(local_178);
    }
    local_70.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_006a4518;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.super_LineParser.Line._M_dataplus._M_p !=
        &local_70.super_LineParser.Line.field_2) {
      operator_delete(local_70.super_LineParser.Line._M_dataplus._M_p,
                      local_70.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    local_298.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_006a4518;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.super_LineParser.Line._M_dataplus._M_p !=
        &local_298.super_LineParser.Line.field_2) {
      operator_delete(local_298.super_LineParser.Line._M_dataplus._M_p,
                      local_298.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    if (local_238.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (char **)0x0) {
      operator_delete(local_238.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_238.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_220);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"Cannot create directory: ",0x19);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1e8,local_258._M_dataplus._M_p,local_258._M_string_length);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestVC.cxx"
                 ,0x32,(char *)local_298.super_LineParser.super_OutputParser._vptr_OutputParser,
                 false);
    if (local_298.super_LineParser.super_OutputParser._vptr_OutputParser != (_func_int **)ppcVar1) {
      operator_delete(local_298.super_LineParser.super_OutputParser._vptr_OutputParser,
                      (ulong)(local_298.super_LineParser.Prefix + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    std::ios_base::~ios_base(local_178);
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTestVC::InitialCheckout(const char* command)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   First perform the initial checkout: " << command << "\n");

  // Make the parent directory in which to perform the checkout.
  std::string parent = cmSystemTools::GetFilenamePath(this->SourceDirectory);
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Perform checkout in directory: " << parent << "\n");
  if (!cmSystemTools::MakeDirectory(parent)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create directory: " << parent << std::endl);
    return false;
  }

  // Construct the initial checkout command line.
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);
  std::vector<char const*> vc_co;
  vc_co.reserve(args.size() + 1);
  for (std::string const& arg : args) {
    vc_co.push_back(arg.c_str());
  }
  vc_co.push_back(nullptr);

  // Run the initial checkout command and log its output.
  this->Log << "--- Begin Initial Checkout ---\n";
  OutputLogger out(this->Log, "co-out> ");
  OutputLogger err(this->Log, "co-err> ");
  bool result = this->RunChild(&vc_co[0], &out, &err, parent.c_str());
  this->Log << "--- End Initial Checkout ---\n";
  if (!result) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Initial checkout failed!" << std::endl);
  }
  return result;
}